

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp.hh
# Opt level: O2

void __thiscall
helix::nasdaq::moldudp_session<helix::nasdaq::nordic_itch_handler>::subscribe
          (moldudp_session<helix::nasdaq::nordic_itch_handler> *this,string *symbol,
          size_t max_orders)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)symbol);
  nordic_itch_handler::subscribe(&this->_handler,&sStack_38,max_orders);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void moldudp_session<Handler>::subscribe(const std::string& symbol, size_t max_orders)
{
    _handler.subscribe(symbol, max_orders);
}